

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool do_fp_cmp(DisasContext_conflict1 *s,arg_rprr_esz *a,undefined1 *fn)

{
  uint32_t oprsz;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  TCGv_ptr ptr;
  uintptr_t o;
  
  if (fn != (undefined1 *)0x0) {
    tcg_ctx = s->uc->tcg_ctx;
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      oprsz = s->sve_len;
      ptr = get_fpstatus_ptr_aarch64(tcg_ctx,a->esz == 1);
      tcg_gen_gvec_4_ptr_aarch64
                (tcg_ctx,a->rd * 0x20 + 0x2c10,a->rn * 0x100 + 0xc10,a->rm * 0x100 + 0xc10,
                 a->pg * 0x20 + 0x2c10,ptr,oprsz,oprsz,0,fn);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ptr + (long)tcg_ctx));
    }
  }
  return fn != (undefined1 *)0x0;
}

Assistant:

static bool do_fp_cmp(DisasContext *s, arg_rprr_esz *a,
                      gen_helper_gvec_4_ptr *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (fn == NULL) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);
        tcg_gen_gvec_4_ptr(tcg_ctx, pred_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           vec_full_reg_offset(s, a->rm),
                           pred_full_reg_offset(s, a->pg),
                           status, vsz, vsz, 0, fn);
        tcg_temp_free_ptr(tcg_ctx, status);
    }
    return true;
}